

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Company *company)

{
  Boss *boss;
  long lVar1;
  bool bVar2;
  __type _Var3;
  uint uVar4;
  string *psVar5;
  string *__rhs;
  ostream *poVar6;
  Employee *pEVar7;
  Employee *__b;
  long lVar8;
  ulong uVar9;
  Employee *pEVar10;
  undefined8 auStack_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong local_90;
  Employee *local_88;
  ulong local_80;
  Employee *local_78;
  ulong local_70;
  Company *local_68;
  Employee *local_60;
  Employee *local_58;
  ostream *local_50;
  ulong local_48;
  Employee *local_40;
  Employee *local_38;
  
  auStack_e0[0] = 0x10415e;
  local_68 = company;
  local_50 = os;
  uVar4 = Boss::getNumberOfEmployees(company->boss);
  local_48 = (ulong)uVar4;
  lVar8 = local_48 * 0xb8;
  lVar1 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
  pEVar7 = (Employee *)((long)auStack_e0 + lVar1 + 8);
  local_38 = pEVar7;
  if (uVar4 != 0) {
    do {
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104190;
      Employee::Employee(pEVar7);
      pEVar7 = pEVar7 + 1;
      lVar8 = lVar8 + -0xb8;
    } while (lVar8 != 0);
  }
  uVar9 = 0;
  local_80 = 0;
  pEVar7 = local_38;
  if (0 < (int)local_48) {
    local_80 = local_48 & 0xffffffff;
  }
  for (; local_80 != uVar9; uVar9 = uVar9 + 1) {
    pEVar10 = local_68->employees[uVar9];
    *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1041d3;
    Employee::operator=(pEVar7,pEVar10);
    pEVar7 = pEVar7 + 1;
  }
  uVar4 = (int)local_48 - 1;
  local_78 = (Employee *)(long)(int)uVar4;
  uVar9 = 0;
  local_70 = 0;
  if (0 < (int)uVar4) {
    local_70 = (ulong)uVar4;
  }
  local_58 = (Employee *)((long)local_78 * 0xb8);
  local_88 = local_38 + (long)local_78;
  *(undefined8 *)((long)auStack_e0 + lVar1) = 2;
  for (; pEVar7 = local_88, pEVar10 = local_78, local_90 = uVar9, uVar9 != local_70;
      uVar9 = uVar9 + 1) {
    while ((long)uVar9 < (long)pEVar10) {
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104246;
      psVar5 = Person::getId_abi_cxx11_(&pEVar7->super_Person);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10425a;
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)psVar5);
      __b = pEVar7 + -1;
      local_60 = pEVar7;
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10426d;
      psVar5 = Person::getId_abi_cxx11_(&__b->super_Person);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10427d;
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar5);
      local_40 = pEVar10;
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104293;
      bVar2 = std::operator<(&local_d0,&local_b0);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10429e;
      std::__cxx11::string::~string((string *)&local_b0);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1042a6;
      std::__cxx11::string::~string((string *)&local_d0);
      pEVar7 = local_60;
      if (bVar2) {
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1042b7;
        std::swap<Employee>(pEVar7,__b);
      }
      uVar9 = local_90;
      pEVar7 = local_40 + -1;
      *(undefined8 *)((long)auStack_e0 + lVar1) = 2;
      pEVar10 = (Employee *)((long)&pEVar7->workDone + 3);
      pEVar7 = __b;
    }
  }
  local_58 = (Employee *)((long)&(local_38->super_Person)._vptr_Person + (long)local_58);
  *(undefined8 *)((long)auStack_e0 + lVar1) = 2;
  for (uVar9 = 0; poVar6 = local_50, local_40 = local_58, pEVar7 = local_78, uVar9 != local_70;
      uVar9 = uVar9 + 1) {
    for (; pEVar10 = local_40, (long)uVar9 < (long)pEVar7;
        pEVar7 = (Employee *)((long)&pEVar7->workDone + 3)) {
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104325;
      psVar5 = Person::getId_abi_cxx11_(&pEVar10->super_Person);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104335;
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)psVar5);
      pEVar10 = local_40 + -1;
      local_60 = pEVar7;
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10434c;
      psVar5 = Person::getId_abi_cxx11_(&pEVar10->super_Person);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10435c;
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar5);
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10436a;
      _Var3 = std::operator==(&local_d0,&local_b0);
      pEVar7 = local_40;
      if (_Var3) {
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104377;
        psVar5 = Person::getName_abi_cxx11_(&pEVar7->super_Person);
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104382;
        __rhs = Person::getName_abi_cxx11_(&pEVar10->super_Person);
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10438d;
        bVar2 = std::operator<(psVar5,__rhs);
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10439c;
        std::__cxx11::string::~string((string *)&local_b0);
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1043a4;
        std::__cxx11::string::~string((string *)&local_d0);
        pEVar7 = local_40;
        if (bVar2) {
          *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1043b5;
          std::swap<Employee>(pEVar7,pEVar10);
        }
      }
      else {
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1043bf;
        std::__cxx11::string::~string((string *)&local_b0);
        *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1043c7;
        std::__cxx11::string::~string((string *)&local_d0);
      }
      pEVar7 = local_60 + -1;
      local_40 = pEVar10;
      *(undefined8 *)((long)auStack_e0 + lVar1) = 2;
    }
  }
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1043fd;
  poVar6 = std::operator<<(poVar6,"Boss : ");
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104405;
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  boss = local_68->boss;
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104415;
  poVar6 = operator<<(poVar6,boss);
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10441d;
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10442c;
  poVar6 = std::operator<<(poVar6,"-------------------------------------\n");
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10443b;
  poVar6 = std::operator<<(poVar6,"Employees :");
  *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104443;
  std::endl<char,std::char_traits<char>>(poVar6);
  pEVar7 = local_38;
  while (pEVar10 = local_38, poVar6 = local_50, bVar2 = local_80 != 0, local_80 = local_80 - 1,
        bVar2) {
    *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104461;
    poVar6 = operator<<(poVar6,pEVar7);
    *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104469;
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    *(undefined8 *)((long)auStack_e0 + lVar1) = 0x104474;
    poVar6 = std::operator<<(poVar6,
                             "----------------------------------------------------------------------"
                            );
    *(undefined8 *)((long)auStack_e0 + lVar1) = 0x10447c;
    std::endl<char,std::char_traits<char>>(poVar6);
    pEVar7 = pEVar7 + 1;
  }
  if (local_48 != 0) {
    lVar8 = local_48 * 0xb8;
    do {
      *(undefined8 *)((long)auStack_e0 + lVar1) = 0x1044a9;
      Person::~Person((Person *)((long)&pEVar10[-1].super_Person._vptr_Person + lVar8));
      lVar8 = lVar8 + -0xb8;
    } while (lVar8 != 0);
  }
  return local_50;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    // copy the value of employees to another array to avoid changes in the original array
    int n = company.boss->getNumberOfEmployees();
    Employee newEmployees[n];
    for (int i = 0; i < n; ++i) {
        newEmployees[i] = *company.employees[i];
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the id's first two chars
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) < newEmployees[j - 1].getId().substr(0, 2))
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the name
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) == newEmployees[j - 1].getId().substr(0, 2) &&
                newEmployees[j].getName() < newEmployees[j - 1].getName())
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    os << "Boss : " << endl << *company.boss << endl << "-------------------------------------\n" << "Employees :"
       << endl;
    for (int i = 0; i < n; ++i) {
        os << newEmployees[i] << endl << "----------------------------------------------------------------------"
           << endl;
    }
    return os;
}